

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.cpp
# Opt level: O0

void pstore::assert_failed(czstring str,czstring file,int line)

{
  ostream *poVar1;
  void *this;
  pointer ppvVar2;
  size_type sVar3;
  pointer ppcVar4;
  long lVar5;
  char *local_278 [4];
  ostream_iterator<const_char_*,_char,_std::char_traits<char>_> local_258;
  pointer local_248;
  char **begin;
  unique_ptr<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
  strs;
  anon_class_1_0_00000001 deleter;
  int frames;
  void **out;
  array<void_*,_64UL> callstack;
  ostream *out_stream;
  int line_local;
  czstring file_local;
  czstring str_local;
  
  callstack._M_elems[0x3f] = &std::cerr;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Assert failed: (");
  poVar1 = std::operator<<(poVar1,str);
  poVar1 = std::operator<<(poVar1,"), file ");
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,", line ");
  this = (void *)std::ostream::operator<<(poVar1,line);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  ppvVar2 = std::array<void_*,_64UL>::data((array<void_*,_64UL> *)&out);
  sVar3 = std::array<void_*,_64UL>::size((array<void_*,_64UL> *)&out);
  strs._M_t.
  super___uniq_ptr_impl<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
  ._M_t.
  super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
  .super__Head_base<0UL,_char_**,_false>._M_head_impl._4_4_ = backtrace(ppvVar2,sVar3 & 0xffffffff);
  ppcVar4 = (pointer)backtrace_symbols(ppvVar2,strs._M_t.
                                               super___uniq_ptr_impl<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                                               .super__Head_base<0UL,_char_**,_false>._M_head_impl.
                                               _4_4_);
  std::unique_ptr<char*,pstore::assert_failed(char_const*,char_const*,int)::$_0_const>::
  unique_ptr<pstore::assert_failed(char_const*,char_const*,int)::__0_const,void>
            ((unique_ptr<char*,pstore::assert_failed(char_const*,char_const*,int)::__0_const> *)
             &begin,ppcVar4,
             (deleter_type *)
             ((long)&strs._M_t.
                     super___uniq_ptr_impl<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                     ._M_t.
                     super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                     .super__Head_base<0UL,_char_**,_false>._M_head_impl + 3));
  ppcVar4 = std::
            unique_ptr<char_*,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/support/assert.cpp:55:34)>
            ::get((unique_ptr<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                   *)&begin);
  lVar5 = (long)strs._M_t.
                super___uniq_ptr_impl<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                ._M_t.
                super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                .super__Head_base<0UL,_char_**,_false>._M_head_impl._4_4_;
  local_248 = ppcVar4;
  std::ostream_iterator<const_char_*,_char,_std::char_traits<char>_>::ostream_iterator
            (&local_258,(ostream_type *)&std::cerr,"\n");
  std::copy<char**,std::ostream_iterator<char_const*,char,std::char_traits<char>>>
            (local_278,ppcVar4,
             (ostream_iterator<const_char_*,_char,_std::char_traits<char>_> *)(ppcVar4 + lVar5));
  std::
  unique_ptr<char_*,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/support/assert.cpp:55:34)>
  ::~unique_ptr((unique_ptr<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                 *)&begin);
  abort();
}

Assistant:

void assert_failed (gsl::czstring const str, gsl::czstring const file, int const line) {
#    ifdef _WIN32
        auto & out_stream = std::wcerr;
#    else
        auto & out_stream = std::cerr;
#    endif
        out_stream << PSTORE_NATIVE_TEXT ("Assert failed: (") << str
                   << PSTORE_NATIVE_TEXT ("), file ") << file << PSTORE_NATIVE_TEXT (", line ")
                   << line << std::endl;
#    if PSTORE_HAVE_BACKTRACE
        {
            std::array<void *, 64U> callstack;
            void ** const out = callstack.data ();
            int const frames = ::backtrace (out, static_cast<int> (callstack.size ()));

            auto const deleter = [] (void * const p) {
                if (p != nullptr) {
                    // NOLINTNEXTLINE(cppcoreguidelines-no-malloc, hicpp-no-malloc)
                    std::free (p);
                }
            };
            std::unique_ptr<gsl::zstring, decltype (deleter)> const strs{
                ::backtrace_symbols (out, frames), deleter};
            auto * const begin = strs.get ();
            std::copy (
                begin, begin + frames,
                std::ostream_iterator<gsl::czstring> (out_stream, PSTORE_NATIVE_TEXT ("\n")));
        }
#    endif // PSTORE_HAVE_BACKTRACE
        std::abort ();
    }